

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int cm_zlib_inflatePrime(z_streamp_conflict strm,int bits,int value)

{
  internal_state *piVar1;
  inflate_state *state;
  int value_local;
  int bits_local;
  z_streamp_conflict strm_local;
  
  if ((strm == (z_streamp_conflict)0x0) || (strm->state == (internal_state *)0x0)) {
    strm_local._4_4_ = -2;
  }
  else {
    piVar1 = strm->state;
    if ((bits < 0x11) && ((uint)(piVar1[0x14].dummy + bits) < 0x21)) {
      *(long *)(piVar1 + 0x12) =
           (long)(int)((value & (int)(1L << ((byte)bits & 0x3f)) - 1U) <<
                      ((byte)piVar1[0x14].dummy & 0x1f)) + *(long *)(piVar1 + 0x12);
      piVar1[0x14].dummy = bits + piVar1[0x14].dummy;
      strm_local._4_4_ = 0;
    }
    else {
      strm_local._4_4_ = -2;
    }
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflatePrime(strm, bits, value)
z_streamp strm;
int bits;
int value;
{
    struct inflate_state FAR *state;

    if (strm == Z_NULL || strm->state == Z_NULL) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (bits > 16 || state->bits + bits > 32) return Z_STREAM_ERROR;
    value &= (1L << bits) - 1;
    state->hold += value << state->bits;
    state->bits += bits;
    return Z_OK;
}